

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O2

void __thiscall swrenderer::PalSpanCommand::PalSpanCommand(PalSpanCommand *this)

{
  uint8_t *puVar1;
  
  puVar1 = drawerargs::dc_destorg;
  (this->super_DrawerCommand)._dest_y =
       (int)((drawerargs::dc_dest - (long)drawerargs::dc_destorg) / (long)drawerargs::dc_pitch);
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006e5a08;
  this->_source = drawerargs::ds_source;
  this->_colormap = drawerargs::ds_colormap;
  this->_xfrac = drawerargs::ds_xfrac;
  this->_yfrac = drawerargs::ds_yfrac;
  this->_y = drawerargs::ds_y;
  this->_x1 = drawerargs::ds_x1;
  this->_x2 = drawerargs::ds_x2;
  this->_destorg = puVar1;
  this->_xstep = drawerargs::ds_xstep;
  this->_ystep = drawerargs::ds_ystep;
  this->_xbits = drawerargs::ds_xbits;
  this->_ybits = drawerargs::ds_ybits;
  this->_srcblend = drawerargs::dc_srcblend;
  this->_destblend = drawerargs::dc_destblend;
  this->_color = drawerargs::ds_color;
  return;
}

Assistant:

DrawerCommand()
	{
		_dest_y = static_cast<int>((swrenderer::drawerargs::dc_dest - swrenderer::drawerargs::dc_destorg) / (swrenderer::drawerargs::dc_pitch));
	}